

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O0

bool __thiscall SQTable::Get(SQTable *this,SQObjectPtr *key,SQObjectPtr *val)

{
  SQString *pSVar1;
  SQHash SVar2;
  _HashNode *p_Var3;
  SQObjectPtr *in_RSI;
  SQTable *in_RDI;
  _HashNode *n;
  SQSharedState *obj;
  SQTable *this_00;
  bool local_1;
  
  if ((in_RSI->super_SQObject)._type == OT_NULL) {
    local_1 = false;
  }
  else {
    SVar2 = HashObj(in_RSI);
    p_Var3 = _Get(in_RDI,in_RSI,SVar2 & in_RDI->_numofnodes - 1U);
    if (p_Var3 == (_HashNode *)0x0) {
      local_1 = false;
    }
    else {
      if ((p_Var3->val).super_SQObject._type == OT_WEAKREF) {
        pSVar1 = (p_Var3->val).super_SQObject._unVal.pString;
        obj = pSVar1->_sharedstate;
        this_00 = (SQTable *)pSVar1->_next;
      }
      else {
        obj = *(SQSharedState **)&(p_Var3->val).super_SQObject;
        this_00 = (p_Var3->val).super_SQObject._unVal.pTable;
      }
      ::SQObjectPtr::operator=((SQObjectPtr *)this_00,(SQObject *)obj);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool SQTable::Get(const SQObjectPtr &key,SQObjectPtr &val)
{
    if(sq_type(key) == OT_NULL)
        return false;
    _HashNode *n = _Get(key, HashObj(key) & (_numofnodes - 1));
    if (n) {
        val = _realval(n->val);
        return true;
    }
    return false;
}